

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O1

bool libtorrent::dht::verify_message_impl
               (bdecode_node *message,span<const_libtorrent::dht::key_desc_t> desc,
               span<libtorrent::bdecode_node> ret,span<char> error)

{
  key_desc_t *pkVar1;
  void *pvVar2;
  bool bVar3;
  bdecode_node *pbVar4;
  bool bVar5;
  type_t tVar6;
  int iVar7;
  size_t sVar8;
  bdecode_node *pbVar9;
  char *pcVar10;
  int *piVar11;
  char *__format;
  long lVar12;
  int iVar13;
  key_desc_t *pkVar14;
  long lVar15;
  bdecode_node *pbVar16;
  int iVar17;
  string_view key;
  bdecode_node msg;
  bdecode_node stack [5];
  bdecode_node local_1f8;
  bdecode_node local_1b8;
  bdecode_node local_178;
  bdecode_node abStack_138 [4];
  
  lVar15 = ret.m_len;
  pbVar9 = ret.m_ptr;
  pkVar14 = desc.m_ptr;
  bdecode_node::non_owning(&local_1f8,message);
  lVar12 = lVar15;
  pbVar16 = pbVar9;
  if (0 < lVar15) {
    do {
      bdecode_node::clear(pbVar16);
      lVar12 = lVar12 + -1;
      pbVar16 = pbVar16 + 1;
    } while (lVar12 != 0);
  }
  lVar12 = 0;
  do {
    *(undefined8 *)((long)abStack_138 + lVar12 + -0x24) = 0;
    *(undefined8 *)((long)abStack_138 + lVar12 + -0x1c) = 0;
    *(undefined8 *)((long)abStack_138 + lVar12 + -0x30) = 0;
    *(undefined8 *)((long)abStack_138 + lVar12 + -0x28) = 0;
    *(undefined8 *)
     ((long)&local_178.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar12) = 0;
    *(undefined8 *)((long)abStack_138 + lVar12 + -0x38) = 0;
    *(undefined4 *)((long)abStack_138 + lVar12 + -0x14) = 0xffffffff;
    *(undefined4 *)((long)abStack_138 + lVar12 + -0x10) = 0xffffffff;
    *(undefined4 *)((long)abStack_138 + lVar12 + -0xc) = 0xffffffff;
    *(undefined4 *)((long)abStack_138 + lVar12 + -8) = 0xffffffff;
    lVar12 = lVar12 + 0x40;
  } while (lVar12 != 0x140);
  tVar6 = bdecode_node::type(&local_1f8);
  if (tVar6 == dict_t) {
    bdecode_node::operator=(&local_178,&local_1f8);
    bVar3 = lVar15 < 1;
    if (0 < lVar15) {
      lVar12 = 0;
      iVar13 = 0;
      iVar17 = 0;
      do {
        pcVar10 = pkVar14[lVar12].name;
        sVar8 = strlen(pcVar10);
        key._M_str = pcVar10;
        key._M_len = sVar8;
        bdecode_node::dict_find(&local_1b8,&local_1f8,key);
        pbVar16 = pbVar9 + lVar12;
        ::std::
        vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
        _M_move_assign(&pbVar16->m_tokens,&local_1b8);
        pbVar9[lVar12].m_size = local_1b8.m_size;
        pbVar4 = pbVar9 + lVar12;
        pbVar4->m_buffer_size = local_1b8.m_buffer_size;
        pbVar4->m_token_idx = local_1b8.m_token_idx;
        *(undefined8 *)(&pbVar4->m_buffer_size + 2) = local_1b8._48_8_;
        pbVar9[lVar12].m_root_tokens = local_1b8.m_root_tokens;
        (&pbVar9[lVar12].m_root_tokens)[1] = (bdecode_token *)local_1b8.m_buffer;
        if (local_1b8.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b8.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b8.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pkVar1 = pkVar14 + lVar12;
        bVar5 = bdecode_node::operator_cast_to_bool(pbVar16);
        if ((bVar5) &&
           (tVar6 = bdecode_node::type(pbVar16), pkVar1->type != none_t && tVar6 != pkVar1->type)) {
          bdecode_node::clear(pbVar16);
        }
        bVar5 = bdecode_node::operator_cast_to_bool(pbVar16);
        if ((bVar5) || ((pkVar1->flags & 1) != 0)) {
          if ((0 < pkVar1->size) &&
             ((bVar5 = bdecode_node::operator_cast_to_bool(pbVar16), bVar5 && (pkVar1->type == 3))))
          {
            if ((pkVar1->flags & 8) == 0) {
              iVar7 = bdecode_node::string_length(pbVar16);
              bVar5 = iVar7 == pkVar1->size;
            }
            else {
              iVar7 = bdecode_node::string_length(pbVar16);
              bVar5 = iVar7 % pkVar1->size == 0;
            }
            if ((!bVar5) && (bdecode_node::clear(pbVar16), (pkVar1->flags & 1) == 0)) {
              pcVar10 = pkVar1->name;
              __format = "invalid value for \'%s\'";
              goto LAB_003c4ddf;
            }
          }
          if ((pkVar1->flags & 2U) == 0) {
            bVar5 = true;
            if ((pkVar1->flags & 4U) != 0) {
              if (iVar17 == 0) {
                iVar17 = 0;
                bVar5 = false;
              }
              else {
                bdecode_node::operator=(&local_1f8,&local_1b8 + iVar17);
                iVar17 = iVar17 + -1;
              }
            }
          }
          else {
            bVar5 = bdecode_node::operator_cast_to_bool(pbVar16);
            if (bVar5) {
              bdecode_node::operator=(&local_1f8,pbVar16);
              bdecode_node::operator=(abStack_138 + iVar17,&local_1f8);
              iVar17 = iVar17 + 1;
              bVar5 = true;
            }
            else {
              lVar12 = (long)iVar13;
              bVar5 = true;
              if (lVar12 < lVar15) {
                piVar11 = &pkVar14[lVar12].flags;
                do {
                  if ((*piVar11 & 4) != 0) break;
                  lVar12 = lVar12 + 1;
                  piVar11 = piVar11 + 6;
                } while (lVar12 < lVar15);
                iVar13 = (int)lVar12;
              }
            }
          }
        }
        else {
          pcVar10 = pkVar1->name;
          __format = "missing \'%s\' key";
LAB_003c4ddf:
          bVar5 = false;
          snprintf(error.m_ptr,error.m_len,__format,pcVar10);
        }
        if (!bVar5) break;
        iVar13 = iVar13 + 1;
        lVar12 = (long)iVar13;
        bVar3 = lVar15 <= lVar12;
      } while (lVar12 < lVar15);
    }
  }
  else {
    bVar3 = false;
    snprintf(error.m_ptr,error.m_len,"not a dictionary");
  }
  lVar12 = 0x100;
  do {
    pvVar2 = *(void **)((long)&local_178.m_tokens.
                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar12);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)abStack_138 + lVar12 + -0x30) - (long)pvVar2);
    }
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  if (local_1f8.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool verify_message_impl(bdecode_node const& message, span<key_desc_t const> desc
	, span<bdecode_node> ret, span<char> error)
{
	TORRENT_ASSERT(desc.size() == ret.size());

	auto const size = ret.size();

	// get a non-root bdecode_node that still
	// points to the root. message should not be copied
	bdecode_node msg = message.non_owning();

	// clear the return buffer
	for (int i = 0; i < size; ++i)
		ret[i].clear();

	// when parsing child nodes, this is the stack
	// of bdecode_nodes to return to
	bdecode_node stack[5];
	int stack_ptr = -1;

	if (msg.type() != bdecode_node::dict_t)
	{
		std::snprintf(error.data(), static_cast<std::size_t>(error.size()), "not a dictionary");
		return false;
	}
	++stack_ptr;
	stack[stack_ptr] = msg;
	for (int i = 0; i < size; ++i)
	{
		key_desc_t const& k = desc[i];

		//		std::fprintf(stderr, "looking for %s in %s\n", k.name, print_entry(*msg).c_str());

		ret[i] = msg.dict_find(k.name);
		// none_t means any type
		if (ret[i] && ret[i].type() != k.type && k.type != bdecode_node::none_t)
			ret[i].clear();
		if (!ret[i] && (k.flags & key_desc_t::optional) == 0)
		{
			// the key was not found, and it's not an optional key
			std::snprintf(error.data(), static_cast<std::size_t>(error.size()), "missing '%s' key", k.name);
			return false;
		}

		if (k.size > 0
			&& ret[i]
			&& k.type == bdecode_node::string_t)
		{
			bool const invalid = (k.flags & key_desc_t::size_divisible)
				? (ret[i].string_length() % k.size) != 0
				: ret[i].string_length() != k.size;

			if (invalid)
			{
				// the string was not of the required size
				ret[i].clear();
				if ((k.flags & key_desc_t::optional) == 0)
				{
					std::snprintf(error.data(), static_cast<std::size_t>(error.size())
						, "invalid value for '%s'", k.name);
					return false;
				}
			}
		}
		if (k.flags & key_desc_t::parse_children)
		{
			TORRENT_ASSERT(k.type == bdecode_node::dict_t);

			if (ret[i])
			{
				++stack_ptr;
				TORRENT_ASSERT(stack_ptr < int(sizeof(stack) / sizeof(stack[0])));
				msg = ret[i];
				stack[stack_ptr] = msg;
			}
			else
			{
				// skip all children
				while (i < size && (desc[i].flags & key_desc_t::last_child) == 0) ++i;
				// if this assert is hit, desc is incorrect
				TORRENT_ASSERT(i < size);
			}
		}
		else if (k.flags & key_desc_t::last_child)
		{
			TORRENT_ASSERT(stack_ptr > 0);
			// this can happen if the specification passed
			// in is unbalanced. i.e. contain more last_child
			// nodes than parse_children
			if (stack_ptr == 0) return false;
			--stack_ptr;
			msg = stack[stack_ptr];
		}
	}
	return true;
}